

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_make_string_op(sexp ctx,sexp self,sexp_sint_t n,sexp len,sexp ch)

{
  undefined1 auVar1 [16];
  int c;
  sexp psVar2;
  ulong in_RCX;
  long in_RDI;
  sexp in_R8;
  int clen;
  int j;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp s;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp b;
  sexp i;
  sexp_uint_t in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  sexp in_stack_ffffffffffffff98;
  sexp in_stack_ffffffffffffffa0;
  sexp ctx_00;
  sexp *local_50;
  undefined8 local_48;
  sexp local_40;
  sexp local_38;
  sexp local_30;
  ulong local_28;
  long local_10;
  sexp local_8;
  
  psVar2 = in_R8;
  if (((ulong)in_R8 & 0xff) == 0x1e) {
    psVar2 = (sexp)((long)(int)((ulong)in_R8 >> 8) << 1 | 1);
  }
  local_40 = (sexp)0x43e;
  local_38 = psVar2;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_10 = in_RDI;
  memset(&local_50,0,0x10);
  ctx_00 = (sexp)&DAT_0000043e;
  memset(&stack0xffffffffffffff98,0,0x10);
  if ((((ulong)local_30 & 0xff) == 0x1e) && (c = (int)((ulong)local_30 >> 8), 0x7f < c)) {
    if ((local_28 & 1) != 1) {
      psVar2 = sexp_type_exception(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                   psVar2);
      return psVar2;
    }
    in_stack_ffffffffffffff90 = sexp_utf8_char_byte_count(c);
    local_40 = sexp_make_bytes_op(ctx_00,in_stack_ffffffffffffffa0,
                                  (sexp_sint_t)in_stack_ffffffffffffff98,
                                  (sexp)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90
                                                ),psVar2);
    if ((((ulong)local_40 & 3) == 0) && (local_40->tag == 0x13)) {
      return local_40;
    }
    for (in_stack_ffffffffffffff94 = 0;
        in_stack_ffffffffffffff80 = (sexp_uint_t)in_stack_ffffffffffffff94,
        auVar1._8_8_ = (long)local_28 >> 0x3f, auVar1._0_8_ = local_28 & 0xfffffffffffffffe,
        (long)in_stack_ffffffffffffff80 < SUB168(auVar1 / SEXT816(2),0);
        in_stack_ffffffffffffff94 = in_stack_ffffffffffffff94 + 1) {
      sexp_utf8_encode_char
                ((uchar *)((local_40->value).flonum_bits +
                          (long)(in_stack_ffffffffffffff94 * in_stack_ffffffffffffff90) + 8),
                 in_stack_ffffffffffffff90,(int)((ulong)local_30 >> 8));
    }
  }
  else {
    local_40 = sexp_make_bytes_op(ctx_00,in_stack_ffffffffffffffa0,
                                  (sexp_sint_t)in_stack_ffffffffffffff98,
                                  (sexp)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90
                                                ),psVar2);
  }
  if ((((ulong)local_40 & 3) == 0) && (local_40->tag == 0x13)) {
    local_8 = local_40;
  }
  else {
    local_50 = &local_40;
    local_48 = *(undefined8 *)(local_10 + 0x6080);
    *(sexp ***)(local_10 + 0x6080) = &local_50;
    *(undefined1 **)(local_10 + 0x6080) = &stack0xffffffffffffff98;
    local_8 = sexp_alloc_tagged_aux
                        ((sexp)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         (size_t)psVar2,in_stack_ffffffffffffff80);
    (local_8->value).type.name = local_40;
    (local_8->value).type.cpl = (sexp)0x0;
    (local_8->value).type.slots = (sexp)(local_40->value).flonum;
    *(undefined8 *)(local_10 + 0x6080) = local_48;
  }
  return local_8;
}

Assistant:

sexp sexp_make_string_op (sexp ctx, sexp self, sexp_sint_t n, sexp len, sexp ch)
{
  sexp i = (sexp_charp(ch) ? sexp_make_fixnum(sexp_unbox_character(ch)) : ch);
#if SEXP_USE_PACKED_STRINGS
  sexp b;
#else
  sexp_gc_var2(b, s);
#endif
#if SEXP_USE_UTF8_STRINGS
  int j, clen;
  if (sexp_charp(ch) && (sexp_unbox_character(ch) >= 0x80)) {
    sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, len);
    clen = sexp_utf8_char_byte_count(sexp_unbox_character(ch));
    b = sexp_make_bytes_op(ctx, self, n,
                           sexp_fx_mul(len, sexp_make_fixnum(clen)), SEXP_VOID);
    if (sexp_exceptionp(b)) return b;
    for (j=0; j<sexp_unbox_fixnum(len); j++)
      sexp_utf8_encode_char((unsigned char*)sexp_bytes_data(b)+(j*clen), clen,
                            sexp_unbox_character(ch));
  } else
#endif
  b = sexp_make_bytes_op(ctx, self, n, len, i);
  if (sexp_exceptionp(b)) return b;
#if SEXP_USE_PACKED_STRINGS
  sexp_pointer_tag(b) = SEXP_STRING;
  return b;
#else
  sexp_gc_preserve2(ctx, b, s);
  s = sexp_alloc_type(ctx, string, SEXP_STRING);
  sexp_string_bytes(s) = b;
  sexp_string_offset(s) = 0;
  sexp_string_size(s) = sexp_bytes_length(b);
#if SEXP_USE_STRING_REF_CACHE
  sexp_cached_char_idx(s) = 0;
  sexp_cached_cursor(s) = sexp_make_string_cursor(0);
#endif
  sexp_update_string_index_lookup(ctx, s);
  sexp_gc_release2(ctx);
  return s;
#endif
}